

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::KnotRefinement<2L>_> * __thiscall
pybind11::class_<anurbs::KnotRefinement<2l>>::
def_static<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>(*)(anurbs::NurbsCurveGeometry<2l>const&,std::vector<double,std::allocator<double>>),pybind11::arg,pybind11::arg>
          (class_<anurbs::KnotRefinement<2l>> *this,char *name_,
          _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
          **f,arg *extra,arg *extra_1)

{
  _func_shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_NurbsCurveGeometry<2L>_ptr_vector<double,_std::allocator<double>_>
  *f_00;
  cpp_function cf;
  object local_68;
  handle local_60;
  cpp_function local_58;
  handle local_50;
  object local_48;
  char *local_40 [4];
  
  f_00 = *f;
  local_68.super_handle.m_ptr = *(handle *)this;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40[0] = name_;
  getattr((pybind11 *)&local_50,local_68.super_handle,name_,(PyObject *)&_Py_NoneStruct);
  local_60.m_ptr = local_50.m_ptr;
  cpp_function::
  cpp_function<std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,anurbs::NurbsCurveGeometry<2l>const&,std::vector<double,std::allocator<double>>,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&local_58,f_00,(name *)local_40,(scope *)&local_68,(sibling *)&local_60,extra,extra_1);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object(&local_48);
  staticmethod::staticmethod((staticmethod *)&local_68,(object *)&local_58);
  cpp_function::name((cpp_function *)&local_60);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_40,(object_api<pybind11::handle> *)this,local_60);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_40,
             (staticmethod *)&local_68);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_40);
  pybind11::object::~object((object *)&local_60);
  pybind11::object::~object(&local_68);
  pybind11::object::~object((object *)&local_58);
  return (class_<anurbs::KnotRefinement<2L>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }